

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::clear(clusterizer<crnlib::vec<16U,_float>_> *this)

{
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *in_RDI;
  
  vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::clear
            ((vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_> *)in_RDI);
  vector<crnlib::vec<16U,_float>_>::clear((vector<crnlib::vec<16U,_float>_> *)in_RDI);
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::clear(in_RDI);
  *(undefined4 *)&in_RDI[3].m_p = 0;
  *(undefined4 *)((long)&in_RDI[3].m_p + 4) = 0;
  in_RDI[4].m_size = 0;
  *(undefined1 *)&in_RDI[4].m_capacity = 0;
  return;
}

Assistant:

void clear() {
    m_training_vecs.clear();
    m_codebook.clear();
    m_nodes.clear();
    m_overall_variance = 0.0f;
    m_split_index = 0;
    m_heap_size = 0;
    m_quick = false;
  }